

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O3

int http_Download(char *url_str,int timeout_secs,char **document,size_t *doc_length,
                 char *content_type)

{
  int iVar1;
  size_t sVar2;
  http_header_t *phVar3;
  char *pcVar4;
  size_t hostlen;
  char *hoststr;
  membuffer request;
  memptr ctype;
  uri_type url;
  http_parser_t response;
  
  sVar2 = strlen(url_str);
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x354,"DOWNLOAD URL : %s\n",
             url_str);
  iVar1 = http_FixStrUrl(url_str,sVar2,&url);
  if (iVar1 == 0) {
    membuffer_init(&request);
    iVar1 = get_hoststr(url_str,&hoststr,&hostlen);
    if (iVar1 == 0) {
      UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x364,
                 "HOSTNAME : %s Length : %zu\n",hoststr,hostlen);
      iVar1 = http_MakeMessage(&request,1,1,"QsbcDCUc",2,url.pathquery.buff,url.pathquery.size,
                               "HOST: ",hoststr,hostlen);
      if (iVar1 == 0) {
        UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x380,
                   "HTTP Buffer:\n%s\n----------END--------\n",request.buf);
        iVar1 = http_RequestAndResponse
                          (&url,request.buf,request.length,HTTPMETHOD_GET,timeout_secs,&response);
        if (iVar1 == 0) {
          UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x391,"Response\n");
          print_http_headers(&response.msg);
          if (content_type != (char *)0x0) {
            phVar3 = httpmsg_find_hdr(&response.msg,4,&ctype);
            if (phVar3 != (http_header_t *)0x0) {
              sVar2 = 0xb3;
              if (ctype.length < 0xb3) {
                sVar2 = ctype.length;
              }
              memcpy(content_type,ctype.buf,sVar2);
              content_type = content_type + sVar2;
            }
            *content_type = '\0';
          }
          *doc_length = response.msg.entity.length;
          if (response.msg.entity.length == 0) {
            *document = (char *)0x0;
          }
          else if (response.msg.status_code == 200) {
            pcVar4 = membuffer_detach(&response.msg.msg);
            memmove(pcVar4,response.msg.entity.buf,*doc_length + 1);
            pcVar4 = (char *)realloc(pcVar4,*doc_length + 1);
            *document = pcVar4;
            if (response.msg.msg.length <= *doc_length) {
              __assert_fail("msg_length > *doc_length",".upnp/src/genlib/net/http/httpreadwrite.c",
                            0x3b4,"int http_Download(const char *, int, char **, size_t *, char *)")
              ;
            }
            if (pcVar4 == (char *)0x0) {
              __assert_fail("*document != NULL",".upnp/src/genlib/net/http/httpreadwrite.c",0x3b5,
                            "int http_Download(const char *, int, char **, size_t *, char *)");
            }
          }
          iVar1 = 0;
          if (response.msg.status_code != 200) {
            iVar1 = response.msg.status_code;
          }
        }
        httpmsg_destroy(&response.msg);
      }
      else {
        UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x378,
                   "HTTP Makemessage failed\n");
      }
      membuffer_destroy(&request);
    }
  }
  return iVar1;
}

Assistant:

int http_Download(const char *url_str,
	int timeout_secs,
	char **document,
	size_t *doc_length,
	char *content_type)
{
	int ret_code;
	uri_type url;
	char *msg_start;
	char *entity_start;
	const char *hoststr;
	http_parser_t response;
	size_t msg_length;
	size_t hostlen;
	memptr ctype;
	size_t copy_len;
	membuffer request;
	size_t url_str_len;

	url_str_len = strlen(url_str);
	/*ret_code = parse_uri( (char*)url_str, url_str_len, &url ); */
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"DOWNLOAD URL : %s\n",
		url_str);
	ret_code = http_FixStrUrl((char *)url_str, url_str_len, &url);
	if (ret_code != UPNP_E_SUCCESS) {
		return ret_code;
	}
	/* make msg */
	membuffer_init(&request);
	ret_code = get_hoststr(url_str, &hoststr, &hostlen);
	if (ret_code != UPNP_E_SUCCESS) {
		return ret_code;
	}
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"HOSTNAME : %s Length : %" PRIzu "\n",
		hoststr,
		hostlen);
	ret_code = http_MakeMessage(&request,
		1,
		1,
		"Q"
		"s"
		"bcDCUc",
		HTTPMETHOD_GET,
		url.pathquery.buff,
		url.pathquery.size,
		"HOST: ",
		hoststr,
		hostlen);
	if (ret_code != 0) {
		UpnpPrintf(UPNP_INFO,
			HTTP,
			__FILE__,
			__LINE__,
			"HTTP Makemessage failed\n");
		membuffer_destroy(&request);
		return ret_code;
	}
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"HTTP Buffer:\n%s\n"
		"----------END--------\n",
		request.buf);
	/* get doc msg */
	ret_code = http_RequestAndResponse(&url,
		request.buf,
		request.length,
		HTTPMETHOD_GET,
		timeout_secs,
		&response);

	if (ret_code != 0) {
		httpmsg_destroy(&response.msg);
		membuffer_destroy(&request);
		return ret_code;
	}
	UpnpPrintf(UPNP_INFO, HTTP, __FILE__, __LINE__, "Response\n");
	print_http_headers(&response.msg);
	/* optional content-type */
	if (content_type) {
		if (httpmsg_find_hdr(&response.msg, HDR_CONTENT_TYPE, &ctype) ==
			NULL) {
			*content_type = '\0'; /* no content-type */
		} else {
			/* safety */
			copy_len = ctype.length < LINE_SIZE - (size_t)1
					   ? ctype.length
					   : LINE_SIZE - (size_t)1;

			memcpy(content_type, ctype.buf, copy_len);
			content_type[copy_len] = '\0';
		}
	}
	/* extract doc from msg */
	if ((*doc_length = response.msg.entity.length) == (size_t)0) {
		/* 0-length msg */
		*document = NULL;
	} else if (response.msg.status_code == HTTP_OK) {
		/*LEAK_FIX_MK */
		/* copy entity */
		entity_start = response.msg.entity.buf; /* what we want */
		msg_length = response.msg.msg.length; /* save for posterity   */
		msg_start = membuffer_detach(&response.msg.msg); /* whole msg */
		/* move entity to the start; copy null-terminator too */
		memmove(msg_start, entity_start, *doc_length + (size_t)1);
		/* save mem for body only */
		*document = realloc(
			msg_start, *doc_length + (size_t)1); /*LEAK_FIX_MK */
		/* *document = Realloc( msg_start,msg_length, *doc_length + 1 );
		 * LEAK_FIX_MK */
		/* shrink can't fail */
		assert(msg_length > *doc_length);
		assert(*document != NULL);
		if (msg_length <= *doc_length || *document == NULL)
			UpnpPrintf(UPNP_INFO,
				HTTP,
				__FILE__,
				__LINE__,
				"msg_length(%" PRIzu ") <= *doc_length(%" PRIzu
				") or document is NULL",
				msg_length,
				*doc_length);
	}
	if (response.msg.status_code == HTTP_OK) {
		ret_code = 0; /* success */
	} else {
		/* server sent error msg (not requested doc) */
		ret_code = response.msg.status_code;
	}
	httpmsg_destroy(&response.msg);
	membuffer_destroy(&request);

	return ret_code;
}